

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O2

void point_add(u8 *r,u8 *p,u8 *q)

{
  u8 *b;
  u8 *a;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  u8 u [30];
  u8 s [30];
  u8 t [30];
  u8 auStack_98 [32];
  u8 local_78 [32];
  u8 local_58 [29];
  byte local_3b;
  
  b = q + 0x1e;
  iVar4 = point_is_zero(p);
  if (iVar4 == 0) {
    a = p + 0x1e;
    iVar4 = point_is_zero(q);
    if (iVar4 == 0) {
      elt_add(auStack_98,p,q);
      iVar4 = elt_is_zero(auStack_98);
      if (iVar4 == 0) {
        elt_inv(local_58,auStack_98);
        elt_add(auStack_98,a,b);
        elt_mul(local_78,local_58,auStack_98);
        elt_square(local_58,local_78);
        elt_add(local_58,local_58,local_78);
        elt_add(local_58,local_58,q);
        local_3b = local_3b ^ 1;
        elt_mul(auStack_98,local_78,local_58);
        elt_add(local_78,auStack_98,a);
        elt_add(r,local_58,p);
        elt_add(r + 0x1e,local_78,r);
        return;
      }
      elt_add(auStack_98,a,b);
      iVar4 = elt_is_zero(auStack_98);
      if (iVar4 == 0) {
        r[0x2c] = '\0';
        r[0x2d] = '\0';
        r[0x2e] = '\0';
        r[0x2f] = '\0';
        r[0x30] = '\0';
        r[0x31] = '\0';
        r[0x32] = '\0';
        r[0x33] = '\0';
        r[0x34] = '\0';
        r[0x35] = '\0';
        r[0x36] = '\0';
        r[0x37] = '\0';
        r[0x38] = '\0';
        r[0x39] = '\0';
        r[0x3a] = '\0';
        r[0x3b] = '\0';
        r[0x20] = '\0';
        r[0x21] = '\0';
        r[0x22] = '\0';
        r[0x23] = '\0';
        r[0x24] = '\0';
        r[0x25] = '\0';
        r[0x26] = '\0';
        r[0x27] = '\0';
        r[0x28] = '\0';
        r[0x29] = '\0';
        r[0x2a] = '\0';
        r[0x2b] = '\0';
        r[0x2c] = '\0';
        r[0x2d] = '\0';
        r[0x2e] = '\0';
        r[0x2f] = '\0';
        r[0x10] = '\0';
        r[0x11] = '\0';
        r[0x12] = '\0';
        r[0x13] = '\0';
        r[0x14] = '\0';
        r[0x15] = '\0';
        r[0x16] = '\0';
        r[0x17] = '\0';
        r[0x18] = '\0';
        r[0x19] = '\0';
        r[0x1a] = '\0';
        r[0x1b] = '\0';
        r[0x1c] = '\0';
        r[0x1d] = '\0';
        r[0x1e] = '\0';
        r[0x1f] = '\0';
        r[0] = '\0';
        r[1] = '\0';
        r[2] = '\0';
        r[3] = '\0';
        r[4] = '\0';
        r[5] = '\0';
        r[6] = '\0';
        r[7] = '\0';
        r[8] = '\0';
        r[9] = '\0';
        r[10] = '\0';
        r[0xb] = '\0';
        r[0xc] = '\0';
        r[0xd] = '\0';
        r[0xe] = '\0';
        r[0xf] = '\0';
        return;
      }
      point_double(r,p);
      return;
    }
    uVar1 = *(undefined8 *)p;
    uVar2 = *(undefined8 *)(p + 8);
    uVar3 = *(undefined8 *)(p + 0x16);
    *(undefined8 *)(r + 0xe) = *(undefined8 *)(p + 0xe);
    *(undefined8 *)(r + 0x16) = uVar3;
    *(undefined8 *)r = uVar1;
    *(undefined8 *)(r + 8) = uVar2;
    uVar5 = *(undefined4 *)a;
    uVar6 = *(undefined4 *)(p + 0x22);
    uVar7 = *(undefined4 *)(p + 0x26);
    uVar8 = *(undefined4 *)(p + 0x2a);
    uVar9 = *(undefined4 *)(p + 0x2c);
    uVar10 = *(undefined4 *)(p + 0x30);
    uVar11 = *(undefined4 *)(p + 0x34);
    uVar12 = *(undefined4 *)(p + 0x38);
  }
  else {
    uVar1 = *(undefined8 *)q;
    uVar2 = *(undefined8 *)(q + 8);
    uVar3 = *(undefined8 *)(q + 0x16);
    *(undefined8 *)(r + 0xe) = *(undefined8 *)(q + 0xe);
    *(undefined8 *)(r + 0x16) = uVar3;
    *(undefined8 *)r = uVar1;
    *(undefined8 *)(r + 8) = uVar2;
    uVar5 = *(undefined4 *)b;
    uVar6 = *(undefined4 *)(q + 0x22);
    uVar7 = *(undefined4 *)(q + 0x26);
    uVar8 = *(undefined4 *)(q + 0x2a);
    uVar9 = *(undefined4 *)(q + 0x2c);
    uVar10 = *(undefined4 *)(q + 0x30);
    uVar11 = *(undefined4 *)(q + 0x34);
    uVar12 = *(undefined4 *)(q + 0x38);
  }
  *(undefined4 *)(r + 0x2c) = uVar9;
  *(undefined4 *)(r + 0x30) = uVar10;
  *(undefined4 *)(r + 0x34) = uVar11;
  *(undefined4 *)(r + 0x38) = uVar12;
  *(undefined4 *)(r + 0x1e) = uVar5;
  *(undefined4 *)(r + 0x22) = uVar6;
  *(undefined4 *)(r + 0x26) = uVar7;
  *(undefined4 *)(r + 0x2a) = uVar8;
  return;
}

Assistant:

static void point_add(u8 *r, u8 *p, u8 *q)
{
	u8 s[30], t[30], u[30];
	u8 *px, *py, *qx, *qy, *rx, *ry;

	px = p;
	py = p + 30;
	qx = q;
	qy = q + 30;
	rx = r;
	ry = r + 30;

	if (point_is_zero(p)) {
		elt_copy(rx, qx);
		elt_copy(ry, qy);
		return;
	}

	if (point_is_zero(q)) {
		elt_copy(rx, px);
		elt_copy(ry, py);
		return;
	}

	elt_add(u, px, qx);

	if (elt_is_zero(u)) {
		elt_add(u, py, qy);
		if (elt_is_zero(u))
			point_double(r, p);
		else {
			elt_zero(rx);
			elt_zero(ry);
		}

		return;
	}

	elt_inv(t, u);
	elt_add(u, py, qy);
	elt_mul(s, t, u);

	elt_square(t, s);
	elt_add(t, t, s);
	elt_add(t, t, qx);
	t[29] ^= 1;

	elt_mul(u, s, t);
	elt_add(s, u, py);
	elt_add(rx, t, px);
	elt_add(ry, s, rx);
}